

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__psd_test(stbi__context *s)

{
  stbi__uint32 sVar1;
  uint uVar2;
  stbi__context *in_RDI;
  int r;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  sVar1 = stbi__get32be((stbi__context *)
                        CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  uVar2 = (uint)(sVar1 == 0x38425053);
  stbi__rewind(in_RDI);
  return uVar2;
}

Assistant:

static int stbi__psd_test(stbi__context *s)
{
   int r = (stbi__get32be(s) == 0x38425053);
   stbi__rewind(s);
   return r;
}